

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# divsufsortxx.h
# Opt level: O1

void divsufsortxx::substring::insertionsort<char*,bitmap::BitmapArray<long>::iterator>
               (char *T,iterator PA,iterator first,iterator last,value_type depth)

{
  ulong uVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  int extraout_var_02;
  undefined4 extraout_var_03;
  ulong uVar5;
  ulong uVar6;
  iterator p1;
  iterator p2;
  
  p1.array_ = PA.array_;
  uVar6 = last.pos_;
  do {
    uVar1 = uVar6 - 1;
    if (uVar1 <= first.pos_) {
      return;
    }
    iVar2 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar6 - 2);
    uVar6 = uVar1;
    do {
      iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar6);
      p1.pos_ = CONCAT44(extraout_var,iVar2) + PA.pos_;
      p2.pos_ = CONCAT44(extraout_var_00,iVar3) + PA.pos_;
      p2.array_ = p1.array_;
      iVar3 = compare<char*,bitmap::BitmapArray<long>::iterator>(T,p1,p2,depth);
      if (iVar3 < 1) goto LAB_001084fa;
      do {
        uVar5 = uVar6;
        iVar4 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar5);
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                  (last.array_,uVar5 - 1,CONCAT44(extraout_var_01,iVar4));
        uVar6 = uVar5 + 1;
        if (last.pos_ <= uVar6) break;
        (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar6);
      } while (extraout_var_02 < 0);
      uVar6 = uVar5 + 1;
    } while (uVar6 < last.pos_);
    uVar6 = uVar5 + 1;
LAB_001084fa:
    if (iVar3 == 0) {
      iVar3 = (*((last.array_)->super_Bitmap)._vptr_Bitmap[5])(last.array_,uVar6);
      (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
                (last.array_,uVar6,~CONCAT44(extraout_var_03,iVar3));
    }
    (*((last.array_)->super_Bitmap)._vptr_Bitmap[4])
              (last.array_,uVar6 - 1,CONCAT44(extraout_var,iVar2));
    uVar6 = uVar1;
  } while( true );
}

Assistant:

void insertionsort(
    StringIterator_type T, const SAIterator_type PA, SAIterator_type first,
    SAIterator_type last,
    typename std::iterator_traits<SAIterator_type>::value_type depth) {
  SAIterator_type a, b;
  typename std::iterator_traits<SAIterator_type>::value_type t;
  int r;

  for (a = last - 1; first < a; --a) {
    for (t = *(a - 1), b = a; 0 < (r = compare(T, PA + t, PA + *b, depth));) {
      do {
        *(b - 1) = *b;
      } while ((++b < last) && (*b < 0));
      if (last <= b) {
        break;
      }
    }
    if (r == 0) {
      *b = ~*b;
    }
    *(b - 1) = t;
  }
}